

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O0

void __thiscall
cppcms::url_dispatcher::binder4<disp>::operator()
          (binder4<disp> *this,string *p1,string *p2,string *p3,string *p4)

{
  ulong uVar1;
  ulong uVar2;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  ulong *in_RDI;
  string *in_R8;
  page_guard<disp,_void> guard;
  disp *in_stack_fffffffffffffef8;
  code *pcVar3;
  page_guard<disp,_void> *in_stack_ffffffffffffff00;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [48];
  string local_50 [80];
  
  page_guard<disp,_void>::page_guard(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  uVar1 = in_RDI[2];
  pcVar3 = (code *)*in_RDI;
  uVar2 = in_RDI[1];
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *(long *)(uVar1 + uVar2) + -1);
  }
  std::__cxx11::string::string(local_50,in_RSI);
  std::__cxx11::string::string(local_80,in_RDX);
  std::__cxx11::string::string(local_a0,in_RCX);
  std::__cxx11::string::string(local_c0,in_R8);
  (*pcVar3)((long *)(uVar1 + uVar2),local_50,local_80,local_a0,local_c0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_50);
  page_guard<disp,_void>::~page_guard((page_guard<disp,_void> *)0x156913);
  return;
}

Assistant:

void operator()(std::string p1,std::string p2,std::string p3,std::string p4) const
			{
				page_guard<C> guard(object);
				(object->*member)(p1,p2,p3,p4);
			}